

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O0

Function *
google::protobuf::internal::MapArenaMessageCreator<CoreML::Specification::MILSpec::Function,_false>
::CreateMessage(Arena *arena)

{
  Arena *arena_local;
  Function *local_28;
  Function *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (Function *)operator_new(0x78);
    CoreML::Specification::MILSpec::Function::Function(local_28);
  }
  else {
    local_28 = (Function *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::MILSpec::Function::typeinfo,
                          0x78);
    CoreML::Specification::MILSpec::Function::Function(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::MILSpec::Function>);
  }
  return local_28;
}

Assistant:

static inline Type* CreateMessage(Arena* arena) {
    return Arena::Create<Type>(arena);
  }